

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O0

int __thiscall Gb_Apu::read_register(Gb_Apu *this,blip_time_t time,uint addr)

{
  long lVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  Gb_Osc *osc;
  int i;
  int data;
  int index;
  int local_1c;
  uint local_18;
  blip_time_t in_stack_ffffffffffffffec;
  
  run_until((Gb_Apu *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  local_18 = (uint)*(byte *)(in_RDI + 0x208 + (long)(in_EDX + -0xff10));
  if (in_EDX == 0xff26) {
    local_18 = local_18 & 0x80 | 0x70;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      lVar1 = *(long *)(in_RDI + (long)local_1c * 8);
      if ((*(int *)(lVar1 + 0x48) != 0) &&
         ((*(int *)(lVar1 + 0x44) != 0 || ((*(byte *)(*(long *)(lVar1 + 0x30) + 4) & 0x40) == 0))))
      {
        local_18 = 1 << ((byte)local_1c & 0x1f) | local_18;
      }
    }
  }
  return local_18;
}

Assistant:

int Gb_Apu::read_register( blip_time_t time, unsigned addr )
{
	run_until( time );
	
	int index = addr - start_addr;
	require( (unsigned) index < register_count );
	int data = regs [index];
	
	if ( addr == status_reg )
	{
		data = (data & 0x80) | 0x70;
		for ( int i = 0; i < osc_count; i++ )
		{
			const Gb_Osc& osc = *oscs [i];
			if ( osc.enabled && (osc.length || !(osc.regs [4] & osc.len_enabled_mask)) )
				data |= 1 << i;
		}
	}
	
	return data;
}